

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O2

bool __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,bool b)

{
  bool bVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    MADPComponentDiscreteActions::SetInitialized(&this->_m_A,false);
    MADPComponentDiscreteObservations::SetInitialized(&this->_m_O,false);
    MADPComponentFactoredStates::SetInitialized(&this->_m_S,false);
    this->_m_initialized = false;
LAB_004c0384:
    bVar1 = true;
  }
  else {
    bVar1 = MADPComponentDiscreteActions::SetInitialized(&this->_m_A,true);
    if (bVar1) {
      bVar1 = MADPComponentDiscreteObservations::SetInitialized(&this->_m_O,true);
      if (bVar1) {
        bVar1 = MADPComponentFactoredStates::SetInitialized(&this->_m_S,true);
        if (bVar1) {
          bVar1 = SanityCheck(this);
          if (bVar1) {
            this->_m_initialized = true;
            goto LAB_004c0384;
          }
        }
      }
    }
    this->_m_initialized = false;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MultiAgentDecisionProcessDiscreteFactoredStates::SetInitialized(bool b)
{

    if(b == true)
    {
        if(     !_m_A.SetInitialized(b)
            ||  !_m_O.SetInitialized(b)
            ||  !_m_S.SetInitialized(b) )
        {
            //error in initialization of sub-components.
            _m_initialized = false;
            return(false);
        }
        ////check if transition- and observation model are present...
        //if(_m_p_tModel == 0)
        //{
            //throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no transition model! - make sure that CreateNewObservationModel() has been called before SetInitialized()");
        //}
        //if(_m_p_oModel == 0)
        //{
            //throw E("MultiAgentDecisionProcessDiscrete::SetInitialized() -initializing a MultiAgentDecisionProcessDiscrete which has no observation model! - make sure that CreateNewObservationModel() has been called before SetInitialized()");

        //}

        if( SanityCheck() )
        {
            _m_initialized = true;
            return(true);
        }
        else
        {
            _m_initialized = false;
            return(false);
        }
    }
    else
    {
        _m_A.SetInitialized(b);
        _m_O.SetInitialized(b);
        _m_S.SetInitialized(b); 
        _m_initialized = false;
        return(true);
    }

}